

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O3

int testpattern(lua_State *L,int idx)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = lua_touserdata(L,idx);
  iVar3 = 0;
  if (pvVar2 != (void *)0x0) {
    iVar1 = lua_getmetatable(L,idx);
    iVar3 = 0;
    if (iVar1 != 0) {
      lua_getfield(L,-0xf4628,"lpeg-pattern");
      iVar1 = lua_rawequal(L,-1,-2);
      if (iVar1 != 0) {
        lua_settop(L,-3);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int testpattern (lua_State *L, int idx) {
  if (lua_touserdata(L, idx)) {  /* value is a userdata? */
    if (lua_getmetatable(L, idx)) {  /* does it have a metatable? */
      luaL_getmetatable(L, PATTERN_T);
      if (lua_rawequal(L, -1, -2)) {  /* does it have the correct mt? */
        lua_pop(L, 2);  /* remove both metatables */
        return 1;
      }
    }
  }
  return 0;
}